

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

FFSVarRec_conflict LookupVarByName(SstStream Stream,char *Name)

{
  uint uVar1;
  uint *puVar2;
  FFSVarRec_conflict pFVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar2 = (uint *)Stream->ReaderMarshalData;
  uVar1 = *puVar2;
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  do {
    if (uVar5 == uVar6) {
      return (FFSVarRec_conflict)0x0;
    }
    pFVar3 = *(FFSVarRec_conflict *)(*(long *)(puVar2 + 2) + uVar6 * 8);
    iVar4 = strcmp(pFVar3->VarName,Name);
    uVar6 = uVar6 + 1;
  } while (iVar4 != 0);
  return pFVar3;
}

Assistant:

static FFSVarRec LookupVarByName(SstStream Stream, const char *Name)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Info->VarCount; i++)
    {
        if (strcmp(Info->VarList[i]->VarName, Name) == 0)
        {
            return Info->VarList[i];
        }
    }

    return NULL;
}